

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

SectionTracker *
Catch::TestCaseTracking::SectionTracker::acquire
          (TrackerContext *ctx,NameAndLocationRef *nameAndLocation)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ITracker *this;
  char *pcVar2;
  SectionTracker *this_00;
  SectionTracker *temp;
  unique_ptr<Catch::TestCaseTracking::SectionTracker> newTracker;
  SectionTracker *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  NameAndLocation local_68;
  ITracker *local_38;
  
  this = ctx->m_currentTracker;
  this_00 = (SectionTracker *)ITracker::findChild(this,nameAndLocation);
  if (this_00 == (SectionTracker *)0x0) {
    pcVar2 = (nameAndLocation->name).m_start;
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,pcVar2,pcVar2 + (nameAndLocation->name).m_size);
    paVar1 = &local_68.name.field_2;
    if (local_88 == &local_78) {
      local_68.name.field_2._8_8_ = local_78._8_8_;
      local_68.name._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_68.name._M_dataplus._M_p = (pointer)local_88;
    }
    local_68.name.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
    local_68.name.field_2._M_local_buf[0] = local_78._M_local_buf[0];
    local_68.name._M_string_length = local_80;
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_68.location.file = (nameAndLocation->location).file;
    local_68.location.line = (nameAndLocation->location).line;
    local_88 = &local_78;
    local_38 = this;
    Detail::
    make_unique<Catch::TestCaseTracking::SectionTracker,Catch::TestCaseTracking::NameAndLocation,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
              ((Detail *)&local_90,&local_68,ctx,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.name._M_dataplus._M_p != paVar1) {
      operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,
                                        local_78._M_local_buf[0]) + 1);
    }
    this_00 = local_90;
    local_90 = (SectionTracker *)0x0;
    local_68.name._M_dataplus._M_p = (pointer)this_00;
    std::
    vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>
    ::emplace_back<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>
              ((vector<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>,std::allocator<Catch::Detail::unique_ptr<Catch::TestCaseTracking::ITracker>>>
                *)&this->m_children,(unique_ptr<Catch::TestCaseTracking::ITracker> *)&local_68);
    if ((SectionTracker *)local_68.name._M_dataplus._M_p != (SectionTracker *)0x0) {
      (**(code **)(*(long *)local_68.name._M_dataplus._M_p + 8))();
    }
    if (local_90 != (SectionTracker *)0x0) {
      (*(local_90->super_TrackerBase).super_ITracker._vptr_ITracker[1])();
    }
  }
  if (ctx->m_runState != CompletedCycle) {
    tryOpen(this_00);
  }
  return this_00;
}

Assistant:

SectionTracker& SectionTracker::acquire( TrackerContext& ctx, NameAndLocationRef const& nameAndLocation ) {
        SectionTracker* tracker;

        ITracker& currentTracker = ctx.currentTracker();
        if ( ITracker* childTracker =
                 currentTracker.findChild( nameAndLocation ) ) {
            assert( childTracker );
            assert( childTracker->isSectionTracker() );
            tracker = static_cast<SectionTracker*>( childTracker );
        } else {
            auto newTracker = Catch::Detail::make_unique<SectionTracker>(
                NameAndLocation{ static_cast<std::string>(nameAndLocation.name),
                                 nameAndLocation.location },
                ctx,
                &currentTracker );
            tracker = newTracker.get();
            currentTracker.addChild( CATCH_MOVE( newTracker ) );
        }

        if ( !ctx.completedCycle() ) {
            tracker->tryOpen();
        }

        return *tracker;
    }